

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qiconloader.cpp
# Opt level: O1

void __thiscall QIconTheme::QIconTheme(QIconTheme *this,QString *themeName)

{
  int *piVar1;
  QDebug this_00;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  Data *pDVar5;
  qsizetype qVar6;
  char cVar7;
  bool bVar8;
  Context CVar9;
  short sVar10;
  undefined2 uVar11;
  int iVar12;
  undefined4 *puVar13;
  Type TVar14;
  long lVar15;
  QString *pQVar16;
  char *pcVar17;
  undefined1 *puVar18;
  QString *key;
  long in_FS_OFFSET;
  QByteArrayView QVar19;
  QLatin1String QVar20;
  QAnyStringView QVar21;
  QAnyStringView QVar22;
  QStringView QVar23;
  QStringView QVar24;
  QAnyStringView QVar25;
  QAnyStringView QVar26;
  QAnyStringView QVar27;
  QAnyStringView QVar28;
  QAnyStringView QVar29;
  QStringView QVar30;
  QStringView QVar31;
  QAnyStringView QVar32;
  QLatin1String QVar33;
  QLatin1String QVar34;
  QLatin1String QVar35;
  QLatin1String QVar36;
  QFileInfo themeDirInfo;
  QDir iconDir;
  QAnyStringView local_1e8;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 local_1d8 [2];
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 local_1c8 [2];
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 local_1b8 [2];
  wrapped_t<QStringBuilder<QString_&,_QLatin1String>,_QString> local_1a8;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 local_188 [2];
  QStringBuilder<QString_&,_QLatin1String> local_178;
  QAnyStringView local_158;
  QDebug local_148;
  storage_type_conflict *psStack_140;
  undefined1 *local_138;
  QString local_128;
  QArrayDataPointer<QString> local_108;
  undefined1 *local_e8;
  undefined1 *puStack_e0;
  QArrayDataPointer<QString> local_d8;
  undefined1 local_b8 [16];
  undefined1 local_a8 [32];
  QArrayDataPointer<QString> local_88;
  undefined1 local_68 [26];
  short sStack_4e;
  short sStack_4c;
  short sStack_4a;
  undefined8 local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (this->m_gtkCaches).d.d = (Data *)0x0;
  (this->m_gtkCaches).d.ptr = (QSharedPointer<QIconCacheGtkReader> *)0x0;
  (this->m_gtkCaches).d.size = 0;
  (this->m_contentDirs).d.d = (Data *)0x0;
  (this->m_contentDirs).d.ptr = (QString *)0x0;
  (this->m_contentDirs).d.size = 0;
  (this->m_keyList).d.d = (Data *)0x0;
  (this->m_keyList).d.ptr = (QIconDirInfo *)0x0;
  (this->m_keyList).d.size = 0;
  (this->m_parents).d.d = (Data *)0x0;
  (this->m_parents).d.ptr = (QString *)0x0;
  *(undefined8 *)((long)&(this->m_parents).d.ptr + 1) = 0;
  *(undefined8 *)((long)&(this->m_parents).d.size + 1) = 0;
  local_b8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_b8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QFile::QFile((QFile *)local_b8);
  local_d8.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_d8.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_d8.ptr = (QString *)&DAT_aaaaaaaaaaaaaaaa;
  QIcon::themeSearchPaths();
  if ((undefined1 *)local_d8.size != (undefined1 *)0x0) {
    lVar15 = 0;
    puVar18 = (undefined1 *)0x0;
    do {
      local_108.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      QDir::QDir((QDir *)&local_108,(QString *)((long)&((local_d8.ptr)->d).d + lVar15));
      local_a8._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_a8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_a8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      QDir::path();
      qVar6 = local_88.size;
      pQVar16 = local_88.ptr;
      pDVar5 = local_88.d;
      local_88.size = 0;
      local_88.d = (Data *)0x0;
      local_88.ptr = (QString *)0x0;
      local_68._0_4_ = SUB84(pDVar5,0);
      local_68._4_4_ = (undefined4)((ulong)pDVar5 >> 0x20);
      local_68._8_4_ = SUB84(pQVar16,0);
      local_68._12_4_ = (undefined4)((ulong)pQVar16 >> 0x20);
      local_68._16_4_ = (undefined4)qVar6;
      local_68._20_4_ = (undefined4)((ulong)qVar6 >> 0x20);
      stack0xffffffffffffffb0 = (char *)CONCAT62(_sStack_4e,0x2f);
      local_48 = themeName;
      QStringBuilder<QStringBuilder<QString,_char16_t>,_const_QString_&>::convertTo<QString>
                ((QString *)local_a8,
                 (QStringBuilder<QStringBuilder<QString,_char16_t>,_const_QString_&> *)local_68);
      piVar1 = (int *)CONCAT44(local_68._4_4_,local_68._0_4_);
      if (piVar1 != (int *)0x0) {
        LOCK();
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (*piVar1 == 0) {
          QArrayData::deallocate((QArrayData *)CONCAT44(local_68._4_4_,local_68._0_4_),2,0x10);
        }
      }
      if (&(local_88.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_88.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_88.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_88.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_88.d)->super_QArrayData,2,0x10);
        }
      }
      local_128.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      QFileInfo::QFileInfo((QFileInfo *)&local_128,(QString *)local_a8);
      cVar7 = QFileInfo::isDir();
      if (cVar7 != '\0') {
        QtPrivate::QMovableArrayOps<QString>::emplace<QString_const&>
                  ((QMovableArrayOps<QString> *)this,(this->m_contentDirs).d.size,
                   (QString *)local_a8);
        QList<QString>::end(&this->m_contentDirs);
        local_68._0_4_ = 0xaaaaaaaa;
        local_68._4_4_ = 0xaaaaaaaa;
        local_68._8_4_ = 0xaaaaaaaa;
        local_68._12_4_ = 0xaaaaaaaa;
        puVar13 = (undefined4 *)operator_new(0x38);
        *(code **)(puVar13 + 2) =
             QtSharedPointer::ExternalRefCountWithContiguousData<QIconCacheGtkReader>::noDeleter;
        puVar13[1] = 1;
        *puVar13 = 1;
        local_68._8_4_ = SUB84(puVar13,0);
        local_68._12_4_ = (undefined4)((ulong)puVar13 >> 0x20);
        QIconCacheGtkReader::QIconCacheGtkReader
                  ((QIconCacheGtkReader *)(puVar13 + 4),(QString *)local_a8);
        *(code **)(puVar13 + 2) =
             QtSharedPointer::ExternalRefCountWithContiguousData<QIconCacheGtkReader>::deleter;
        local_68._0_8_ = (QIconCacheGtkReader *)(puVar13 + 4);
        QtPrivate::QMovableArrayOps<QSharedPointer<QIconCacheGtkReader>>::
        emplace<QSharedPointer<QIconCacheGtkReader>>
                  ((QMovableArrayOps<QSharedPointer<QIconCacheGtkReader>> *)&this->m_gtkCaches,
                   (this->m_gtkCaches).d.size,(QSharedPointer<QIconCacheGtkReader> *)local_68);
        QList<QSharedPointer<QIconCacheGtkReader>_>::end(&this->m_gtkCaches);
        QSharedPointer<QIconCacheGtkReader>::deref((Data *)CONCAT44(local_68._12_4_,local_68._8_4_))
        ;
      }
      if (this->m_valid == false) {
        local_88.d = (Data *)local_a8;
        local_88.ptr = (QString *)0xc;
        local_88.size = 0x685a48;
        QStringBuilder<QString_&,_QLatin1String>::convertTo<QString>
                  ((QString *)local_68,(QStringBuilder<QString_&,_QLatin1String> *)&local_88);
        QFile::setFileName((QString *)local_b8);
        if ((QIconCacheGtkReader *)local_68._0_8_ != (QIconCacheGtkReader *)0x0) {
          LOCK();
          *(int *)local_68._0_8_ = *(int *)local_68._0_8_ + -1;
          UNLOCK();
          if (*(int *)local_68._0_8_ == 0) {
            QArrayData::deallocate((QArrayData *)local_68._0_8_,2,0x10);
          }
        }
        bVar8 = (bool)QFile::exists();
        this->m_valid = bVar8;
        lcIconLoader();
        if (((byte)lcIconLoader::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) != 0
           ) {
          local_68._0_4_ = 2;
          local_68._4_4_ = 0;
          local_68._8_4_ = 0;
          local_68._12_4_ = 0;
          local_68._16_4_ = 0;
          local_68._20_4_ = 0;
          stack0xffffffffffffffb0 = lcIconLoader::category.name;
          QMessageLogger::debug();
          this_00.stream = local_148.stream;
          QVar19.m_data = (storage_type *)0x15;
          QVar19.m_size = (qsizetype)&local_88;
          QString::fromUtf8(QVar19);
          QTextStream::operator<<(&(this_00.stream)->ts,(QString *)&local_88);
          pDVar5 = local_88.d;
          if (&(local_88.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_88.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_88.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(&(local_88.d)->super_QArrayData,2,0x10);
            }
          }
          if ((local_148.stream)->space == true) {
            QTextStream::operator<<(&(local_148.stream)->ts,' ');
          }
          QFile::fileName();
          pQVar16 = local_88.ptr;
          if (local_88.ptr == (QString *)0x0) {
            pQVar16 = (QString *)&QString::_empty;
          }
          QDebug::putString((QChar *)&local_148,(ulong)pQVar16);
          if ((local_148.stream)->space == true) {
            QTextStream::operator<<(&(local_148.stream)->ts,' ');
          }
          pcVar17 = "false";
          if (this->m_valid != false) {
            pcVar17 = "true";
          }
          QTextStream::operator<<(&(local_148.stream)->ts,pcVar17);
          if ((local_148.stream)->space == true) {
            QTextStream::operator<<(&(local_148.stream)->ts,' ');
          }
          pDVar5 = local_88.d;
          if (&(local_88.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_88.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_88.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(&(local_88.d)->super_QArrayData,2,0x10);
            }
          }
          QDebug::~QDebug(&local_148);
        }
      }
      QFileInfo::~QFileInfo((QFileInfo *)&local_128);
      if ((QArrayData *)local_a8._0_8_ != (QArrayData *)0x0) {
        LOCK();
        *(int *)local_a8._0_8_ = *(int *)local_a8._0_8_ + -1;
        UNLOCK();
        if (*(int *)local_a8._0_8_ == 0) {
          QArrayData::deallocate((QArrayData *)local_a8._0_8_,2,0x10);
        }
      }
      QDir::~QDir((QDir *)&local_108);
      puVar18 = puVar18 + 1;
      lVar15 = lVar15 + 0x18;
    } while (puVar18 < (ulong)local_d8.size);
  }
  if (this->m_valid != false) {
    local_e8 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_e0 = &DAT_aaaaaaaaaaaaaaaa;
    QFile::fileName();
    QSettings::QSettings((QSettings *)&local_e8,(QString *)local_68,IniFormat,(QObject *)0x0);
    if ((QIconCacheGtkReader *)local_68._0_8_ != (QIconCacheGtkReader *)0x0) {
      LOCK();
      *(int *)local_68._0_8_ = *(int *)local_68._0_8_ + -1;
      UNLOCK();
      if (*(int *)local_68._0_8_ == 0) {
        QArrayData::deallocate((QArrayData *)local_68._0_8_,2,0x10);
      }
    }
    local_108.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_108.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_108.ptr = (QString *)&DAT_aaaaaaaaaaaaaaaa;
    QSettings::allKeys();
    if ((undefined1 *)local_108.size != (undefined1 *)0x0) {
      lVar15 = local_108.size * 0x18;
      pQVar16 = local_108.ptr;
      do {
        QVar20.m_data = &DAT_00000005;
        QVar20.m_size = (qsizetype)pQVar16;
        cVar7 = QString::endsWith(QVar20,0x685a6b);
        if (cVar7 != '\0') {
          QVar21.m_size = (size_t)&local_e8;
          QVar21.field_0.m_data_utf8 = local_68;
          QSettings::value(QVar21);
          iVar12 = ::QVariant::toInt((bool *)local_68);
          ::QVariant::~QVariant((QVariant *)local_68);
          if (iVar12 != 0) {
            local_128.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
            local_128.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
            local_128.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
            QString::left(&local_128,pQVar16,(pQVar16->d).size + -5);
            local_68._0_4_ = SUB84(local_128.d.d,0);
            local_68._4_4_ = (undefined4)((ulong)local_128.d.d >> 0x20);
            local_68._8_4_ = SUB84(local_128.d.ptr,0);
            local_68._12_4_ = (undefined4)((ulong)local_128.d.ptr >> 0x20);
            local_68._16_4_ = (undefined4)local_128.d.size;
            local_68._20_4_ = (undefined4)((ulong)local_128.d.size >> 0x20);
            if (&(local_128.d.d)->super_QArrayData != (QArrayData *)0x0) {
              LOCK();
              ((local_128.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                   ((local_128.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                   1;
              UNLOCK();
            }
            local_48 = (QString *)0xaaaaaaaa00020001;
            stack0xffffffffffffffb0 = (char *)(ulong)(ushort)iVar12;
            local_138 = &DAT_aaaaaaaaaaaaaaaa;
            local_148.stream = (Stream *)&DAT_aaaaaaaaaaaaaaaa;
            psStack_140 = (storage_type_conflict *)&DAT_aaaaaaaaaaaaaaaa;
            local_a8._8_8_ = &DAT_00000005;
            local_a8._16_8_ = "/Type";
            local_178.b.m_data = (char *)0x0;
            local_178.a = (QString *)0x0;
            local_178.b.m_size = 0;
            local_a8._0_8_ = (PrivateShared *)&local_128;
            QAnyStringView::QAnyStringView<QStringBuilder<QString_&,_QLatin1String>,_true>
                      (&local_158,(QStringBuilder<QString_&,_QLatin1String> *)local_a8,
                       (wrapped_t<QStringBuilder<QString_&,_QLatin1String>,_QString> *)&local_178);
            QVar22.m_size = (size_t)&local_e8;
            QVar22.field_0.m_data = &local_88;
            QSettings::value(QVar22);
            ::QVariant::toString();
            ::QVariant::~QVariant((QVariant *)&local_88);
            if ((QArrayData *)local_178.a != (QArrayData *)0x0) {
              LOCK();
              (((QBasicAtomicInt *)&(local_178.a)->d)->_q_value).super___atomic_base<int>._M_i =
                   (((QBasicAtomicInt *)&(local_178.a)->d)->_q_value).super___atomic_base<int>._M_i
                   + -1;
              UNLOCK();
              if ((((QBasicAtomicInt *)&(local_178.a)->d)->_q_value).super___atomic_base<int>._M_i
                  == 0) {
                QArrayData::deallocate((QArrayData *)local_178.a,2,0x10);
              }
            }
            if (local_138 == (undefined1 *)0x8) {
              QVar24.m_data = psStack_140;
              QVar24.m_size = 8;
              QVar34.m_data = "Scalable";
              QVar34.m_size = 8;
              cVar7 = QtPrivate::equalStrings(QVar24,QVar34);
              TVar14 = Scalable;
              if (cVar7 == '\0') goto LAB_0027a445;
            }
            else if ((local_138 == (undefined1 *)0x5) &&
                    (QVar23.m_data = psStack_140, QVar23.m_size = 5, QVar33.m_data = "Fixed",
                    QVar33.m_size = 5, cVar7 = QtPrivate::equalStrings(QVar23,QVar33), cVar7 != '\0'
                    )) {
              TVar14 = Fixed;
            }
            else {
LAB_0027a445:
              TVar14 = Threshold;
            }
            local_48._0_3_ = CONCAT12(TVar14,(short)local_48);
            local_178.b.m_size = 10;
            local_178.b.m_data = "/Threshold";
            local_1a8.d.d = (Data *)0x0;
            local_1a8.d.ptr = (char16_t *)0x0;
            local_1a8.d.size = 0;
            local_178.a = &local_128;
            QAnyStringView::QAnyStringView<QStringBuilder<QString_&,_QLatin1String>,_true>
                      ((QAnyStringView *)local_188,&local_178,&local_1a8);
            ::QVariant::QVariant((QVariant *)local_a8,2);
            QVar25.m_size = (size_t)&local_e8;
            QVar25.field_0.m_data_utf8 = (char *)&local_88;
            QSettings::value(QVar25,(QVariant *)local_188[0].m_data);
            sVar10 = ::QVariant::toInt((bool *)&local_88);
            sStack_4a = sVar10;
            ::QVariant::~QVariant((QVariant *)&local_88);
            ::QVariant::~QVariant((QVariant *)local_a8);
            if (&(local_1a8.d.d)->super_QArrayData != (QArrayData *)0x0) {
              LOCK();
              ((local_1a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                   ((local_1a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if (((local_1a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
                  0) {
                QArrayData::deallocate(&(local_1a8.d.d)->super_QArrayData,2,0x10);
              }
            }
            local_178.b.m_size = 8;
            local_178.b.m_data = "/MinSize";
            local_1a8.d.d = (Data *)0x0;
            local_1a8.d.ptr = (char16_t *)0x0;
            local_1a8.d.size = 0;
            local_178.a = &local_128;
            QAnyStringView::QAnyStringView<QStringBuilder<QString_&,_QLatin1String>,_true>
                      ((QAnyStringView *)local_1b8,&local_178,&local_1a8);
            ::QVariant::QVariant((QVariant *)local_a8,iVar12);
            QVar26.m_size = (size_t)&local_e8;
            QVar26.field_0.m_data_utf8 = (char *)&local_88;
            QSettings::value(QVar26,(QVariant *)local_1b8[0].m_data);
            sVar10 = ::QVariant::toInt((bool *)&local_88);
            sStack_4c = sVar10;
            ::QVariant::~QVariant((QVariant *)&local_88);
            ::QVariant::~QVariant((QVariant *)local_a8);
            if (&(local_1a8.d.d)->super_QArrayData != (QArrayData *)0x0) {
              LOCK();
              ((local_1a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                   ((local_1a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if (((local_1a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
                  0) {
                QArrayData::deallocate(&(local_1a8.d.d)->super_QArrayData,2,0x10);
              }
            }
            local_178.b.m_size = 8;
            local_178.b.m_data = "/MaxSize";
            local_1a8.d.d = (Data *)0x0;
            local_1a8.d.ptr = (char16_t *)0x0;
            local_1a8.d.size = 0;
            local_178.a = &local_128;
            QAnyStringView::QAnyStringView<QStringBuilder<QString_&,_QLatin1String>,_true>
                      ((QAnyStringView *)local_1c8,&local_178,&local_1a8);
            ::QVariant::QVariant((QVariant *)local_a8,iVar12);
            QVar27.m_size = (size_t)&local_e8;
            QVar27.field_0.m_data_utf8 = (char *)&local_88;
            QSettings::value(QVar27,(QVariant *)local_1c8[0].m_data);
            sVar10 = ::QVariant::toInt((bool *)&local_88);
            stack0xffffffffffffffb0 = CONCAT22(sVar10,local_68._24_2_);
            ::QVariant::~QVariant((QVariant *)&local_88);
            ::QVariant::~QVariant((QVariant *)local_a8);
            if (&(local_1a8.d.d)->super_QArrayData != (QArrayData *)0x0) {
              LOCK();
              ((local_1a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                   ((local_1a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if (((local_1a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
                  0) {
                QArrayData::deallocate(&(local_1a8.d.d)->super_QArrayData,2,0x10);
              }
            }
            local_178.b.m_size = (qsizetype)&DAT_00000006;
            local_178.b.m_data = "/Scale";
            local_1a8.d.d = (Data *)0x0;
            local_1a8.d.ptr = (char16_t *)0x0;
            local_1a8.d.size = 0;
            local_178.a = &local_128;
            QAnyStringView::QAnyStringView<QStringBuilder<QString_&,_QLatin1String>,_true>
                      ((QAnyStringView *)local_1d8,&local_178,&local_1a8);
            ::QVariant::QVariant((QVariant *)local_a8,1);
            QVar28.m_size = (size_t)&local_e8;
            QVar28.field_0.m_data_utf8 = (char *)&local_88;
            QSettings::value(QVar28,(QVariant *)local_1d8[0].m_data);
            uVar11 = ::QVariant::toInt((bool *)&local_88);
            local_48 = (QString *)CONCAT62(local_48._2_6_,uVar11);
            ::QVariant::~QVariant((QVariant *)&local_88);
            ::QVariant::~QVariant((QVariant *)local_a8);
            if (&(local_1a8.d.d)->super_QArrayData != (QArrayData *)0x0) {
              LOCK();
              ((local_1a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                   ((local_1a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if (((local_1a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
                  0) {
                QArrayData::deallocate(&(local_1a8.d.d)->super_QArrayData,2,0x10);
              }
            }
            local_a8._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
            local_a8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
            local_a8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
            local_178.b.m_size = 8;
            local_178.b.m_data = "/Context";
            local_1a8.d.d = (Data *)0x0;
            local_1a8.d.ptr = (char16_t *)0x0;
            local_1a8.d.size = 0;
            local_178.a = &local_128;
            QAnyStringView::QAnyStringView<QStringBuilder<QString_&,_QLatin1String>,_true>
                      (&local_1e8,&local_178,&local_1a8);
            QVar29.m_size = (size_t)&local_e8;
            QVar29.field_0.m_data = &local_88;
            QSettings::value(QVar29);
            ::QVariant::toString();
            ::QVariant::~QVariant((QVariant *)&local_88);
            if (&(local_1a8.d.d)->super_QArrayData != (QArrayData *)0x0) {
              LOCK();
              ((local_1a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                   ((local_1a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if (((local_1a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
                  0) {
                QArrayData::deallocate(&(local_1a8.d.d)->super_QArrayData,2,0x10);
              }
            }
            uVar2 = local_a8._0_8_;
            if ((QArrayData *)local_a8._0_8_ != (QArrayData *)0x0) {
              LOCK();
              *(int *)local_a8._0_8_ = *(int *)local_a8._0_8_ + 1;
              UNLOCK();
            }
            if ((char *)local_a8._16_8_ == (char *)0x9) {
              QVar31.m_data = (storage_type_conflict *)local_a8._8_8_;
              QVar31.m_size = 9;
              QVar36.m_data = "MimeTypes";
              QVar36.m_size = 9;
              cVar7 = QtPrivate::equalStrings(QVar31,QVar36);
              CVar9 = cVar7 * '\x02';
            }
            else {
              if ((char *)local_a8._16_8_ == (char *)0xc) {
                QVar30.m_data = (storage_type_conflict *)local_a8._8_8_;
                QVar30.m_size = 0xc;
                QVar35.m_data = "Applications";
                QVar35.m_size = 0xc;
                cVar7 = QtPrivate::equalStrings(QVar30,QVar35);
                CVar9 = Applications;
                if (cVar7 != '\0') goto LAB_0027a8b9;
              }
              CVar9 = UnknownContext;
            }
LAB_0027a8b9:
            local_48._0_4_ = CONCAT13(CVar9,(undefined3)local_48);
            if ((QArrayData *)uVar2 != (QArrayData *)0x0) {
              LOCK();
              *(int *)uVar2 = *(int *)uVar2 + -1;
              UNLOCK();
              if (*(int *)uVar2 == 0) {
                QArrayData::deallocate((QArrayData *)uVar2,2,0x10);
              }
            }
            QtPrivate::QMovableArrayOps<QIconDirInfo>::emplace<QIconDirInfo_const&>
                      ((QMovableArrayOps<QIconDirInfo> *)&this->m_keyList,(this->m_keyList).d.size,
                       (QIconDirInfo *)local_68);
            QList<QIconDirInfo>::end(&this->m_keyList);
            if ((QArrayData *)local_a8._0_8_ != (QArrayData *)0x0) {
              LOCK();
              *(int *)local_a8._0_8_ = *(int *)local_a8._0_8_ + -1;
              UNLOCK();
              if (*(int *)local_a8._0_8_ == 0) {
                QArrayData::deallocate((QArrayData *)local_a8._0_8_,2,0x10);
              }
            }
            if (local_148.stream != (Stream *)0x0) {
              LOCK();
              *(int *)local_148.stream = *(int *)local_148.stream + -1;
              UNLOCK();
              if (*(int *)local_148.stream == 0) {
                QArrayData::deallocate((QArrayData *)local_148.stream,2,0x10);
              }
            }
            piVar1 = (int *)CONCAT44(local_68._4_4_,local_68._0_4_);
            if (piVar1 != (int *)0x0) {
              LOCK();
              *piVar1 = *piVar1 + -1;
              UNLOCK();
              if (*piVar1 == 0) {
                QArrayData::deallocate((QArrayData *)CONCAT44(local_68._4_4_,local_68._0_4_),2,0x10)
                ;
              }
            }
            local_68._0_8_ = (QIconCacheGtkReader *)CONCAT44(local_68._4_4_,local_68._0_4_);
            if (&(local_128.d.d)->super_QArrayData != (QArrayData *)0x0) {
              LOCK();
              ((local_128.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                   ((local_128.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              local_68._0_8_ = (QIconCacheGtkReader *)CONCAT44(local_68._4_4_,local_68._0_4_);
              if (((local_128.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
                  0) {
                QArrayData::deallocate(&(local_128.d.d)->super_QArrayData,2,0x10);
              }
            }
          }
        }
        pQVar16 = pQVar16 + 1;
        lVar15 = lVar15 + -0x18;
      } while (lVar15 != 0);
    }
    QVar32.m_size = (size_t)&local_e8;
    QVar32.field_0.m_data = local_68;
    QSettings::value(QVar32);
    ::QVariant::toStringList();
    uVar4 = local_a8._16_8_;
    uVar3 = local_a8._8_8_;
    uVar2 = local_a8._0_8_;
    local_a8._0_8_ = (QArrayData *)0x0;
    local_a8._8_8_ = (QString *)0x0;
    local_a8._16_8_ = (char *)0x0;
    local_88.d = (this->m_parents).d.d;
    local_88.ptr = (this->m_parents).d.ptr;
    (this->m_parents).d.d = (Data *)uVar2;
    (this->m_parents).d.ptr = (QString *)uVar3;
    local_88.size = (this->m_parents).d.size;
    (this->m_parents).d.size = uVar4;
    QArrayDataPointer<QString>::~QArrayDataPointer(&local_88);
    QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)local_a8);
    ::QVariant::~QVariant((QVariant *)local_68);
    local_68._16_4_ = 0;
    local_68._20_4_ = 0;
    local_68._0_4_ = 0;
    local_68._4_4_ = 0;
    local_68._8_4_ = 0;
    local_68._12_4_ = 0;
    QtPrivate::sequential_erase_with_copy<QList<QString>,QString>
              (&this->m_parents,(QString *)local_68);
    piVar1 = (int *)CONCAT44(local_68._4_4_,local_68._0_4_);
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        QArrayData::deallocate((QArrayData *)CONCAT44(local_68._4_4_,local_68._0_4_),2,0x10);
      }
    }
    QArrayDataPointer<QString>::~QArrayDataPointer(&local_108);
    QSettings::~QSettings((QSettings *)&local_e8);
  }
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_d8);
  QFile::~QFile((QFile *)local_b8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QIconTheme::QIconTheme(const QString &themeName)
        : m_valid(false)
{
    QFile themeIndex;

    const QStringList iconDirs = QIcon::themeSearchPaths();
    for ( int i = 0 ; i < iconDirs.size() ; ++i) {
        QDir iconDir(iconDirs[i]);
        QString themeDir = iconDir.path() + u'/' + themeName;
        QFileInfo themeDirInfo(themeDir);

        if (themeDirInfo.isDir()) {
            m_contentDirs << themeDir;
            m_gtkCaches << QSharedPointer<QIconCacheGtkReader>::create(themeDir);
        }

        if (!m_valid) {
            themeIndex.setFileName(themeDir + "/index.theme"_L1);
            m_valid = themeIndex.exists();
            qCDebug(lcIconLoader) << "Probing theme file at" << themeIndex.fileName() << m_valid;
        }
    }
#if QT_CONFIG(settings)
    if (m_valid) {
        const QSettings indexReader(themeIndex.fileName(), QSettings::IniFormat);
        const QStringList keys = indexReader.allKeys();
        for (const QString &key : keys) {
            if (key.endsWith("/Size"_L1)) {
                // Note the QSettings ini-format does not accept
                // slashes in key names, hence we have to cheat
                if (int size = indexReader.value(key).toInt()) {
                    QString directoryKey = key.left(key.size() - 5);
                    QIconDirInfo dirInfo(directoryKey);
                    dirInfo.size = size;
                    QString type = indexReader.value(directoryKey + "/Type"_L1).toString();

                    if (type == "Fixed"_L1)
                        dirInfo.type = QIconDirInfo::Fixed;
                    else if (type == "Scalable"_L1)
                        dirInfo.type = QIconDirInfo::Scalable;
                    else
                        dirInfo.type = QIconDirInfo::Threshold;

                    dirInfo.threshold = indexReader.value(directoryKey +
                                                          "/Threshold"_L1,
                                                          2).toInt();

                    dirInfo.minSize = indexReader.value(directoryKey + "/MinSize"_L1, size).toInt();

                    dirInfo.maxSize = indexReader.value(directoryKey + "/MaxSize"_L1, size).toInt();

                    dirInfo.scale = indexReader.value(directoryKey + "/Scale"_L1, 1).toInt();

                    const QString context = indexReader.value(directoryKey + "/Context"_L1).toString();
                    dirInfo.context = [context]() {
                        if (context == "Applications"_L1)
                            return QIconDirInfo::Applications;
                        else if (context == "MimeTypes"_L1)
                            return QIconDirInfo::MimeTypes;
                        else
                            return QIconDirInfo::UnknownContext;
                    }();

                    m_keyList.append(dirInfo);
                }
            }
        }

        // Parent themes provide fallbacks for missing icons
        m_parents = indexReader.value("Icon Theme/Inherits"_L1).toStringList();
        m_parents.removeAll(QString());
    }
#endif // settings
}